

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::executor_function_tag>
                 (long param_1,long param_2,ulong param_3,byte *param_4)

{
  ulong uVar1;
  byte *pbVar2;
  bool bVar3;
  void *pointer_1;
  void *pvVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 uVar9;
  bool bVar10;
  bad_alloc ex;
  
  uVar1 = param_2 + 3;
  if (param_1 != 0) {
    uVar8 = 4;
    bVar10 = false;
    do {
      pbVar2 = *(byte **)(param_1 + uVar8 * 8);
      if (pbVar2 != (byte *)0x0) {
        bVar3 = true;
        if ((uVar1 >> 2 <= (ulong)*pbVar2) && ((ulong)pbVar2 % param_3 == 0)) {
          *(undefined8 *)(param_1 + uVar8 * 8) = 0;
          pbVar2[param_2] = *pbVar2;
          bVar3 = false;
          param_4 = pbVar2;
        }
        if (!bVar3) break;
      }
      bVar10 = 4 < uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 6);
    if (!bVar10) {
      return param_4;
    }
    lVar6 = 0;
    do {
      pvVar4 = *(void **)(param_1 + 0x20 + lVar6 * 8);
      if (pvVar4 != (void *)0x0) {
        *(undefined8 *)(param_1 + 0x20 + lVar6 * 8) = 0;
        free(pvVar4);
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  uVar8 = 0x10;
  if (0x10 < param_3) {
    uVar8 = param_3;
  }
  uVar7 = ((uVar1 & 0xfffffffffffffffc) + 1) % uVar8;
  lVar6 = uVar8 - uVar7;
  if (uVar7 == 0) {
    lVar6 = 0;
  }
  pvVar4 = (void *)aligned_alloc(uVar8,lVar6 + (uVar1 & 0xfffffffffffffffc) + 1);
  if (pvVar4 != (void *)0x0) {
    uVar9 = 0;
    if (uVar1 < 0x400) {
      uVar9 = (undefined1)(uVar1 >> 2);
    }
    *(undefined1 *)((long)pvVar4 + param_2) = uVar9;
    return pvVar4;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = std::ostream::operator<<;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }